

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

int PrintAction(action *ap,FILE *fp,int indent)

{
  uint uVar1;
  char *pcVar2;
  undefined4 in_register_00000014;
  undefined8 uVar3;
  int iVar4;
  char *pcVar5;
  ulong uVar6;
  rule *rp;
  
  uVar3 = CONCAT44(in_register_00000014,indent);
  iVar4 = 0;
  switch(ap->type) {
  case SHIFT:
    pcVar2 = ap->sp->name;
    uVar6 = (ulong)(uint)((ap->x).stp)->statenum;
    pcVar5 = "%*s shift        %-7d";
    break;
  case ACCEPT:
    pcVar2 = ap->sp->name;
    pcVar5 = "%*s accept";
    goto LAB_00109cf3;
  case REDUCE:
    rp = (ap->x).rp;
    pcVar2 = ap->sp->name;
    uVar1 = rp->iRule;
    pcVar5 = "%*s reduce       %-7d";
    goto LAB_00109d5c;
  case ERROR:
    pcVar2 = ap->sp->name;
    pcVar5 = "%*s error";
LAB_00109cf3:
    fprintf((FILE *)fp,pcVar5,uVar3,pcVar2);
    goto switchD_00109c94_default;
  case SSCONFLICT:
    pcVar2 = ap->sp->name;
    uVar6 = (ulong)(uint)((ap->x).stp)->statenum;
    pcVar5 = "%*s shift        %-7d ** Parsing conflict **";
    break;
  case SRCONFLICT:
  case RRCONFLICT:
    pcVar2 = ap->sp->name;
    uVar6 = (ulong)(uint)((ap->x).rp)->iRule;
    pcVar5 = "%*s reduce       %-7d ** Parsing conflict **";
    break;
  case SH_RESOLVED:
    if (showPrecedenceConflict == 0) {
      return 0;
    }
    pcVar2 = ap->sp->name;
    uVar6 = (ulong)(uint)((ap->x).stp)->statenum;
    pcVar5 = "%*s shift        %-7d -- dropped by precedence";
    break;
  case RD_RESOLVED:
    if (showPrecedenceConflict == 0) {
      return 0;
    }
    pcVar2 = ap->sp->name;
    uVar6 = (ulong)(uint)((ap->x).rp)->iRule;
    pcVar5 = "%*s reduce %-7d -- dropped by precedence";
    break;
  case NOT_USED:
    goto switchD_00109c94_caseD_9;
  case SHIFTREDUCE:
    rp = (ap->x).rp;
    pcVar2 = ap->sp->name;
    uVar1 = rp->iRule;
    pcVar5 = "%*s shift-reduce %-7d";
LAB_00109d5c:
    fprintf((FILE *)fp,pcVar5,uVar3,pcVar2,(ulong)uVar1);
    RulePrint(fp,rp,-1);
  default:
    goto switchD_00109c94_default;
  }
  fprintf((FILE *)fp,pcVar5,uVar3,pcVar2,uVar6);
switchD_00109c94_default:
  iVar4 = 1;
  if (ap->spOpt != (symbol *)0x0) {
    fprintf((FILE *)fp,"  /* because %s==%s */",ap->sp->name,ap->spOpt->name);
  }
switchD_00109c94_caseD_9:
  return iVar4;
}

Assistant:

int PrintAction(
  struct action *ap,          /* The action to print */
  FILE *fp,                   /* Print the action here */
  int indent                  /* Indent by this amount */
){
  int result = 1;
  switch( ap->type ){
    case SHIFT: {
      struct state *stp = ap->x.stp;
      fprintf(fp,"%*s shift        %-7d",indent,ap->sp->name,stp->statenum);
      break;
    }
    case REDUCE: {
      struct rule *rp = ap->x.rp;
      fprintf(fp,"%*s reduce       %-7d",indent,ap->sp->name,rp->iRule);
      RulePrint(fp, rp, -1);
      break;
    }
    case SHIFTREDUCE: {
      struct rule *rp = ap->x.rp;
      fprintf(fp,"%*s shift-reduce %-7d",indent,ap->sp->name,rp->iRule);
      RulePrint(fp, rp, -1);
      break;
    }
    case ACCEPT:
      fprintf(fp,"%*s accept",indent,ap->sp->name);
      break;
    case ERROR:
      fprintf(fp,"%*s error",indent,ap->sp->name);
      break;
    case SRCONFLICT:
    case RRCONFLICT:
      fprintf(fp,"%*s reduce       %-7d ** Parsing conflict **",
        indent,ap->sp->name,ap->x.rp->iRule);
      break;
    case SSCONFLICT:
      fprintf(fp,"%*s shift        %-7d ** Parsing conflict **", 
        indent,ap->sp->name,ap->x.stp->statenum);
      break;
    case SH_RESOLVED:
      if( showPrecedenceConflict ){
        fprintf(fp,"%*s shift        %-7d -- dropped by precedence",
                indent,ap->sp->name,ap->x.stp->statenum);
      }else{
        result = 0;
      }
      break;
    case RD_RESOLVED:
      if( showPrecedenceConflict ){
        fprintf(fp,"%*s reduce %-7d -- dropped by precedence",
                indent,ap->sp->name,ap->x.rp->iRule);
      }else{
        result = 0;
      }
      break;
    case NOT_USED:
      result = 0;
      break;
  }
  if( result && ap->spOpt ){
    fprintf(fp,"  /* because %s==%s */", ap->sp->name, ap->spOpt->name);
  }
  return result;
}